

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O0

exr_result_t update_pack_unpack_ptrs(exr_decode_pipeline_t *decode)

{
  size_t *in_RDI;
  undefined4 unaff_retaddr;
  exr_transcoding_pipeline_buffer_id_t unaff_retaddr_00;
  size_t sampsize;
  exr_storage_t stortype;
  exr_result_t rv;
  long local_20;
  int local_14;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((*(char *)((long)in_RDI + 0x2e) == '\x02') || (*(char *)((long)in_RDI + 0x2e) == '\x03')) {
    local_20 = (long)(int)in_RDI[5] * (long)*(int *)((long)in_RDI + 0x24);
    if ((*(ushort *)((long)in_RDI + 10) & 1) != 0) {
      local_20 = local_20 + 1;
    }
    if (in_RDI[10] == local_20 << 2) {
      internal_decode_free_buffer
                ((exr_decode_pipeline_t *)sampsize,unaff_retaddr_00,
                 (void **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
      in_RDI[0x12] = in_RDI[0x10];
      local_14 = 0;
    }
    else {
      local_14 = internal_decode_alloc_buffer
                           (decode,rv,(void **)sampsize,
                            (size_t *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    }
    if (local_14 != 0) {
      return local_14;
    }
    if ((*(ushort *)((long)in_RDI + 10) & 4) != 0) {
      return 0;
    }
  }
  if (in_RDI[7] == in_RDI[8]) {
    internal_decode_free_buffer
              ((exr_decode_pipeline_t *)sampsize,unaff_retaddr_00,
               (void **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
    in_RDI[0xe] = in_RDI[0xc];
    local_14 = 0;
  }
  else {
    local_14 = internal_decode_alloc_buffer
                         (decode,rv,(void **)sampsize,
                          (size_t *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                          CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  }
  return local_14;
}

Assistant:

OPENEXR_CORE_INTERNAL_NAMESPACE_SOURCE_ENTER

/**************************************/

static exr_result_t
update_pack_unpack_ptrs (exr_decode_pipeline_t* decode)
{
    exr_result_t  rv;
    exr_storage_t stortype = ((exr_storage_t) decode->chunk.type);

    if (stortype == EXR_STORAGE_DEEP_SCANLINE ||
        stortype == EXR_STORAGE_DEEP_TILED)
    {
        size_t sampsize =
            (((size_t) decode->chunk.width) * ((size_t) decode->chunk.height));

        if ((decode->decode_flags & EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
            sampsize += 1;
        sampsize *= sizeof (int32_t);

        if (decode->chunk.sample_count_table_size == sampsize)
        {
            internal_decode_free_buffer (
                decode,
                EXR_TRANSCODE_BUFFER_SAMPLES,
                (void**) &(decode->sample_count_table),
                &(decode->sample_count_alloc_size));

            decode->sample_count_table = (int32_t*) decode->packed_sample_count_table;
            rv                         = EXR_ERR_SUCCESS;
        }
        else
        {
            rv = internal_decode_alloc_buffer (
                decode,
                EXR_TRANSCODE_BUFFER_SAMPLES,
                (void**) &(decode->sample_count_table),
                &(decode->sample_count_alloc_size),
                sampsize);
        }

        if (rv != EXR_ERR_SUCCESS ||
            (decode->decode_flags & EXR_DECODE_SAMPLE_DATA_ONLY) != 0)
            return rv;
    }

    if (decode->chunk.packed_size == decode->chunk.unpacked_size)
    {
        internal_decode_free_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_UNPACKED,
            (void**) &(decode->unpacked_buffer),
            &(decode->unpacked_alloc_size));

        decode->unpacked_buffer = decode->packed_buffer;
        rv                      = EXR_ERR_SUCCESS;
    }
    else
    {
        rv = internal_decode_alloc_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_UNPACKED,
            (void**) &(decode->unpacked_buffer),
            &(decode->unpacked_alloc_size),
            decode->chunk.unpacked_size);
    }

    return rv;
}